

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bibtexreader.hpp
# Opt level: O1

bool bibtex::
     read<boost::spirit::basic_istream_iterator<char,std::char_traits<char>>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,boost::spirit::char_encoding::standard_wide>>,0l>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char>,0l>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,boost::proto::argsns_::list1<boost::proto::exprns_::expr<boost::proto::tagns_::tag::minus,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::char_,boost::spirit::char_encoding::standard>>,0l>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::eol>,0l>>,2l>>,1l>>,2l>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::eol>,0l>>,2l>>,2l>const,std::vector<bibtex::BibTeXEntry,std::allocator<bibtex::BibTeXEntry>>>
               (basic_istream_iterator<char,_std::char_traits<char>_> *first,
               basic_istream_iterator<char,_std::char_traits<char>_> *last,
               expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::standard_wide>_>,_0L>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<char>,_0L>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<boost::proto::exprns_::expr<boost::proto::tagns_::tag::minus,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::char_,_boost::spirit::char_encoding::standard>_>,_0L>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::eol>,_0L>_>,_2L>_>,_1L>_>,_2L>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::eol>,_0L>_>,_2L>_>,_2L>
               *skipper,vector<bibtex::BibTeXEntry,_std::allocator<bibtex::BibTeXEntry>_> *entries,
               enable_if<boost::is_same<bibtex::BibTeXEntry,_bibtex::BibTeXEntry>,_void> *param_5)

{
  bool bVar1;
  bool bVar2;
  skipper_type skipper_;
  type context;
  BibTeXReader<boost::spirit::basic_istream_iterator<char,_std::char_traits<char>_>,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::standard_wide>_>,_0L>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<char>,_0L>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<boost::proto::exprns_::expr<boost::proto::tagns_::tag::minus,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::char_,_boost::spirit::char_encoding::standard>_>,_0L>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::eol>,_0L>_>,_2L>_>,_1L>_>,_2L>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::eol>,_0L>_>,_2L>_>,_2L>_>
  parser;
  multi_pass<std::basic_istream<char,_std::char_traits<char>_>,_boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::istream,_boost::spirit::iterator_policies::split_std_deque>_>
  local_6c8;
  multi_pass<std::basic_istream<char,_std::char_traits<char>_>,_boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::istream,_boost::spirit::iterator_policies::split_std_deque>_>
  local_6b8;
  alternative<boost::fusion::cons<boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::standard_wide>_>,_boost::fusion::cons<boost::spirit::qi::sequence<boost::fusion::cons<boost::spirit::qi::literal_char<boost::spirit::char_encoding::standard,_true,_false>,_boost::fusion::cons<boost::spirit::qi::kleene<boost::spirit::qi::difference<boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::char_,_boost::spirit::char_encoding::standard>_>,_boost::spirit::qi::eol_parser>_>,_boost::fusion::cons<boost::spirit::qi::eol_parser,_boost::fusion::nil_>_>_>_>,_boost::fusion::nil_>_>_>
  local_6a7;
  proto_child0 local_6a0;
  context<boost::fusion::cons<std::vector<bibtex::BibTeXEntry,_std::allocator<bibtex::BibTeXEntry>_>_&,_boost::fusion::nil_>,_boost::spirit::locals<mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>_>
  local_698;
  BibTeXReader<boost::spirit::basic_istream_iterator<char,_std::char_traits<char>_>,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::standard_wide>_>,_0L>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<char>,_0L>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<boost::proto::exprns_::expr<boost::proto::tagns_::tag::minus,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::char_,_boost::spirit::char_encoding::standard>_>,_0L>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::eol>,_0L>_>,_2L>_>,_1L>_>,_2L>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::eol>,_0L>_>,_2L>_>,_2L>_>
  local_680;
  
  BibTeXReader<boost::spirit::basic_istream_iterator<char,_std::char_traits<char>_>,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::standard_wide>_>,_0L>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<char>,_0L>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<boost::proto::exprns_::expr<boost::proto::tagns_::tag::minus,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::char_,_boost::spirit::char_encoding::standard>_>,_0L>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::eol>,_0L>_>,_2L>_>,_1L>_>,_2L>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::eol>,_0L>_>,_2L>_>,_2L>_>
  ::BibTeXReader(&local_680);
  local_6c8.
  super_base_from_member<boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::istream,_boost::spirit::iterator_policies::split_std_deque>::shared<std::basic_istream<char,_std::char_traits<char>_>_>_*,_0>
  .member = (last->
            super_multi_pass<std::basic_istream<char,_std::char_traits<char>_>,_boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::istream,_boost::spirit::iterator_policies::split_std_deque>_>
            ).
            super_base_from_member<boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::istream,_boost::spirit::iterator_policies::split_std_deque>::shared<std::basic_istream<char,_std::char_traits<char>_>_>_*,_0>
            .member;
  local_6c8.super_unique<std::basic_istream<char,_std::char_traits<char>_>_>.
  super_multi_pass_unique<std::basic_istream<char,_std::char_traits<char>_>,_boost::spirit::iterator_policies::ref_counted::unique,_boost::spirit::iterator_policies::no_check::unique,_boost::spirit::iterator_policies::istream::unique<std::basic_istream<char,_std::char_traits<char>_>_>,_boost::spirit::iterator_policies::split_std_deque::unique<char>,_true,_true,_true>
  .super_unique<char>.queued_position =
       (multi_pass_unique<std::basic_istream<char,_std::char_traits<char>_>,_boost::spirit::iterator_policies::ref_counted::unique,_boost::spirit::iterator_policies::no_check::unique,_boost::spirit::iterator_policies::istream::unique<std::basic_istream<char,_std::char_traits<char>_>_>,_boost::spirit::iterator_policies::split_std_deque::unique<char>,_true,_true,_true>
        )(last->
         super_multi_pass<std::basic_istream<char,_std::char_traits<char>_>,_boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::istream,_boost::spirit::iterator_policies::split_std_deque>_>
         ).super_unique<std::basic_istream<char,_std::char_traits<char>_>_>.
         super_multi_pass_unique<std::basic_istream<char,_std::char_traits<char>_>,_boost::spirit::iterator_policies::ref_counted::unique,_boost::spirit::iterator_policies::no_check::unique,_boost::spirit::iterator_policies::istream::unique<std::basic_istream<char,_std::char_traits<char>_>_>,_boost::spirit::iterator_policies::split_std_deque::unique<char>,_true,_true,_true>
         .super_unique<char>.queued_position;
  if (local_6c8.
      super_base_from_member<boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::istream,_boost::spirit::iterator_policies::split_std_deque>::shared<std::basic_istream<char,_std::char_traits<char>_>_>_*,_0>
      .member != (shared<std::basic_istream<char,_std::char_traits<char>_>_> *)0x0) {
    LOCK();
    ((local_6c8.
      super_base_from_member<boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::istream,_boost::spirit::iterator_policies::split_std_deque>::shared<std::basic_istream<char,_std::char_traits<char>_>_>_*,_0>
     .member)->
    super_multi_pass_shared<std::basic_istream<char,_std::char_traits<char>_>,_boost::spirit::iterator_policies::ref_counted::shared,_boost::spirit::iterator_policies::no_check::shared,_boost::spirit::iterator_policies::istream::shared<std::basic_istream<char,_std::char_traits<char>_>_>,_boost::spirit::iterator_policies::split_std_deque::shared<char>_>
    ).super_shared.count.value_ =
         ((local_6c8.
           super_base_from_member<boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::istream,_boost::spirit::iterator_policies::split_std_deque>::shared<std::basic_istream<char,_std::char_traits<char>_>_>_*,_0>
          .member)->
         super_multi_pass_shared<std::basic_istream<char,_std::char_traits<char>_>,_boost::spirit::iterator_policies::ref_counted::shared,_boost::spirit::iterator_policies::no_check::shared,_boost::spirit::iterator_policies::istream::shared<std::basic_istream<char,_std::char_traits<char>_>_>,_boost::spirit::iterator_policies::split_std_deque::shared<char>_>
         ).super_shared.count.value_ + 1;
    UNLOCK();
    LOCK();
    ((local_6c8.
      super_base_from_member<boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::istream,_boost::spirit::iterator_policies::split_std_deque>::shared<std::basic_istream<char,_std::char_traits<char>_>_>_*,_0>
     .member)->
    super_multi_pass_shared<std::basic_istream<char,_std::char_traits<char>_>,_boost::spirit::iterator_policies::ref_counted::shared,_boost::spirit::iterator_policies::no_check::shared,_boost::spirit::iterator_policies::istream::shared<std::basic_istream<char,_std::char_traits<char>_>_>,_boost::spirit::iterator_policies::split_std_deque::shared<char>_>
    ).super_shared.count.value_ =
         ((local_6c8.
           super_base_from_member<boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::istream,_boost::spirit::iterator_policies::split_std_deque>::shared<std::basic_istream<char,_std::char_traits<char>_>_>_*,_0>
          .member)->
         super_multi_pass_shared<std::basic_istream<char,_std::char_traits<char>_>,_boost::spirit::iterator_policies::ref_counted::shared,_boost::spirit::iterator_policies::no_check::shared,_boost::spirit::iterator_policies::istream::shared<std::basic_istream<char,_std::char_traits<char>_>_>,_boost::spirit::iterator_policies::split_std_deque::shared<char>_>
         ).super_shared.count.value_ + 1;
    UNLOCK();
  }
  local_6a7.elements.cdr.car.
  super_sequence_base<boost::spirit::qi::sequence<boost::fusion::cons<boost::spirit::qi::literal_char<boost::spirit::char_encoding::standard,_true,_false>,_boost::fusion::cons<boost::spirit::qi::kleene<boost::spirit::qi::difference<boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::char_,_boost::spirit::char_encoding::standard>_>,_boost::spirit::qi::eol_parser>_>,_boost::fusion::cons<boost::spirit::qi::eol_parser,_boost::fusion::nil_>_>_>_>,_boost::fusion::cons<boost::spirit::qi::literal_char<boost::spirit::char_encoding::standard,_true,_false>,_boost::fusion::cons<boost::spirit::qi::kleene<boost::spirit::qi::difference<boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::char_,_boost::spirit::char_encoding::standard>_>,_boost::spirit::qi::eol_parser>_>,_boost::fusion::cons<boost::spirit::qi::eol_parser,_boost::fusion::nil_>_>_>_>
  .elements.car.ch = (skipper->child1).child0.child0.child0;
  local_6a0.ref.t_ =
       (reference_wrapper<boost::spirit::qi::symbols<char,_char,_boost::spirit::qi::tst<char,_char>,_boost::spirit::qi::tst_pass_through>_>
        )(reference_wrapper<boost::spirit::qi::symbols<char,_char,_boost::spirit::qi::tst<char,_char>,_boost::spirit::qi::tst_pass_through>_>
          )local_680.
           super_grammar<boost::spirit::basic_istream_iterator<char,_std::char_traits<char>_>,_bibtex::BibTeXEntry_(),_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::standard_wide>_>,_0L>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<char>,_0L>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<boost::proto::exprns_::expr<boost::proto::tagns_::tag::minus,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::char_,_boost::spirit::char_encoding::standard>_>,_0L>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::eol>,_0L>_>,_2L>_>,_1L>_>,_2L>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::eol>,_0L>_>,_2L>_>,_2L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
           .super_extends<_f9105958_>.proto_expr_.child0.ref.t_;
  local_6b8.
  super_base_from_member<boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::istream,_boost::spirit::iterator_policies::split_std_deque>::shared<std::basic_istream<char,_std::char_traits<char>_>_>_*,_0>
  .member = local_6c8.
            super_base_from_member<boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::istream,_boost::spirit::iterator_policies::split_std_deque>::shared<std::basic_istream<char,_std::char_traits<char>_>_>_*,_0>
            .member;
  local_6b8.super_unique<std::basic_istream<char,_std::char_traits<char>_>_>.
  super_multi_pass_unique<std::basic_istream<char,_std::char_traits<char>_>,_boost::spirit::iterator_policies::ref_counted::unique,_boost::spirit::iterator_policies::no_check::unique,_boost::spirit::iterator_policies::istream::unique<std::basic_istream<char,_std::char_traits<char>_>_>,_boost::spirit::iterator_policies::split_std_deque::unique<char>,_true,_true,_true>
  .super_unique<char>.queued_position =
       local_6c8.super_unique<std::basic_istream<char,_std::char_traits<char>_>_>.
       super_multi_pass_unique<std::basic_istream<char,_std::char_traits<char>_>,_boost::spirit::iterator_policies::ref_counted::unique,_boost::spirit::iterator_policies::no_check::unique,_boost::spirit::iterator_policies::istream::unique<std::basic_istream<char,_std::char_traits<char>_>_>,_boost::spirit::iterator_policies::split_std_deque::unique<char>,_true,_true,_true>
       .super_unique<char>.queued_position;
  local_698.attributes.car = entries;
  bVar1 = boost::spirit::qi::
          kleene<boost::spirit::qi::reference<boost::spirit::qi::rule<boost::spirit::basic_istream_iterator<char,std::char_traits<char>>,bibtex::BibTeXEntry(),boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,boost::spirit::char_encoding::standard_wide>>,0l>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char>,0l>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,boost::proto::argsns_::list1<boost::proto::exprns_::expr<boost::proto::tagns_::tag::minus,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::char_,boost::spirit::char_encoding::standard>>,0l>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::eol>,0l>>,2l>>,1l>>,2l>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::eol>,0l>>,2l>>,2l>const,boost::spirit::unused_type,boost::spirit::unused_type>const>>
          ::
          parse<boost::spirit::basic_istream_iterator<char,std::char_traits<char>>,boost::spirit::context<boost::fusion::cons<std::vector<bibtex::BibTeXEntry,std::allocator<bibtex::BibTeXEntry>>&,boost::fusion::nil_>,boost::spirit::locals<mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>>,boost::spirit::qi::alternative<boost::fusion::cons<boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,boost::spirit::char_encoding::standard_wide>>,boost::fusion::cons<boost::spirit::qi::sequence<boost::fusion::cons<boost::spirit::qi::literal_char<boost::spirit::char_encoding::standard,true,false>,boost::fusion::cons<boost::spirit::qi::kleene<boost::spirit::qi::difference<boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::char_,boost::spirit::char_encoding::standard>>,boost::spirit::qi::eol_parser>>,boost::fusion::cons<boost::spirit::qi::eol_parser,boost::fusion::nil_>>>>,boost::fusion::nil_>>>,std::vector<bibtex::BibTeXEntry,std::allocator<bibtex::BibTeXEntry>>>
                    ((kleene<boost::spirit::qi::reference<boost::spirit::qi::rule<boost::spirit::basic_istream_iterator<char,std::char_traits<char>>,bibtex::BibTeXEntry(),boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,boost::spirit::char_encoding::standard_wide>>,0l>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char>,0l>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,boost::proto::argsns_::list1<boost::proto::exprns_::expr<boost::proto::tagns_::tag::minus,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::char_,boost::spirit::char_encoding::standard>>,0l>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::eol>,0l>>,2l>>,1l>>,2l>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::eol>,0l>>,2l>>,2l>const,boost::spirit::unused_type,boost::spirit::unused_type>const>>
                      *)&local_6a0,first,
                     (basic_istream_iterator<char,_std::char_traits<char>_> *)&local_6b8,&local_698,
                     &local_6a7,entries);
  if (bVar1) {
    do {
      bVar2 = boost::spirit::qi::
              alternative<boost::fusion::cons<boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,boost::spirit::char_encoding::standard_wide>>,boost::fusion::cons<boost::spirit::qi::sequence<boost::fusion::cons<boost::spirit::qi::literal_char<boost::spirit::char_encoding::standard,true,false>,boost::fusion::cons<boost::spirit::qi::kleene<boost::spirit::qi::difference<boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::char_,boost::spirit::char_encoding::standard>>,boost::spirit::qi::eol_parser>>,boost::fusion::cons<boost::spirit::qi::eol_parser,boost::fusion::nil_>>>>,boost::fusion::nil_>>>
              ::
              parse<boost::spirit::basic_istream_iterator<char,std::char_traits<char>>,boost::spirit::unused_type_const,boost::spirit::unused_type,boost::spirit::unused_type_const>
                        ((alternative<boost::fusion::cons<boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,boost::spirit::char_encoding::standard_wide>>,boost::fusion::cons<boost::spirit::qi::sequence<boost::fusion::cons<boost::spirit::qi::literal_char<boost::spirit::char_encoding::standard,true,false>,boost::fusion::cons<boost::spirit::qi::kleene<boost::spirit::qi::difference<boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::char_,boost::spirit::char_encoding::standard>>,boost::spirit::qi::eol_parser>>,boost::fusion::cons<boost::spirit::qi::eol_parser,boost::fusion::nil_>>>>,boost::fusion::nil_>>>
                          *)&local_6a7,first,
                         (basic_istream_iterator<char,_std::char_traits<char>_> *)&local_6b8,
                         (unused_type *)&boost::spirit::unused,(unused_type *)&boost::spirit::unused
                         ,(unused_type *)&boost::spirit::unused);
    } while (bVar2);
  }
  boost::spirit::
  multi_pass<std::basic_istream<char,_std::char_traits<char>_>,_boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::istream,_boost::spirit::iterator_policies::split_std_deque>_>
  ::~multi_pass(&local_6b8);
  boost::spirit::
  multi_pass<std::basic_istream<char,_std::char_traits<char>_>,_boost::spirit::iterator_policies::default_policy<boost::spirit::iterator_policies::ref_counted,_boost::spirit::iterator_policies::no_check,_boost::spirit::iterator_policies::istream,_boost::spirit::iterator_policies::split_std_deque>_>
  ::~multi_pass(&local_6c8);
  BibTeXReader<boost::spirit::basic_istream_iterator<char,_std::char_traits<char>_>,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::standard_wide>_>,_0L>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<char>,_0L>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<boost::proto::exprns_::expr<boost::proto::tagns_::tag::minus,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::char_,_boost::spirit::char_encoding::standard>_>,_0L>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::eol>,_0L>_>,_2L>_>,_1L>_>,_2L>,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::eol>,_0L>_>,_2L>_>,_2L>_>
  ::~BibTeXReader(&local_680);
  return bVar1;
}

Assistant:

inline bool read(ForwardIterator first, ForwardIterator last, Skipper& skipper,
    Container& entries, boost::enable_if<boost::is_same<
        typename Container::value_type, BibTeXEntry> >* /*dummy*/ = NULL)
{
    BibTeXReader<ForwardIterator, Skipper> parser;
    return boost::spirit::qi::phrase_parse(first, last, *parser, skipper,
        entries);
}